

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

char * sx_os_path_abspath(char *dst,int size,char *path)

{
  char *pcVar1;
  char abs_path [4096];
  char acStack_1018 [4104];
  
  pcVar1 = realpath(path,acStack_1018);
  if (pcVar1 == (char *)0x0) {
    *dst = '\0';
  }
  else {
    sx_strcpy(dst,size,acStack_1018);
  }
  return dst;
}

Assistant:

char* sx_os_path_abspath(char* dst, int size, const char* path)
{
#if SX_PLATFORM_POSIX
    char abs_path[PATH_MAX];
    if (realpath(path, abs_path) != NULL) {
        sx_strcpy(dst, size, abs_path);
    } else {
        dst[0] = '\0';
    }
    return dst;
#elif SX_PLATFORM_WINDOWS
    if (GetFullPathNameA(path, (DWORD)size, dst, NULL) == 0)
        dst[0] = '\0';
    return dst;
#else
#    error "Not Implemented"
#endif
}